

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_expression_assertion.hpp
# Opt level: O2

ExpressionResult * __thiscall
iutest::detail::ExpressionLHS<int>::operator==
          (ExpressionResult *__return_storage_ptr__,ExpressionLHS<int> *this,int *rhs)

{
  AssertionResult *pAVar1;
  AssertionResult local_38;
  
  local_38.m_result = this->m_lhs == *rhs;
  local_38.m_message._M_dataplus._M_p = (pointer)&local_38.m_message.field_2;
  local_38.m_message.field_2._M_local_buf[0] = '\0';
  local_38.m_message._M_string_length = 0;
  pAVar1 = AssertionResult::operator<<(&local_38,&this->m_message);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])" == ");
  pAVar1 = AssertionResult::operator<<(pAVar1,rhs);
  AssertionResult::AssertionResult(&__return_storage_ptr__->m_result,pAVar1);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

IIUT_DECL_EXPRESSION_OP(==)
    IIUT_DECL_EXPRESSION_OP(!=)
    IIUT_DECL_EXPRESSION_OP(<)
    IIUT_DECL_EXPRESSION_OP(<=)
    IIUT_DECL_EXPRESSION_OP(>)
    IIUT_DECL_EXPRESSION_OP(>=)
    IIUT_DECL_EXPRESSION_OP(&&)
    IIUT_DECL_EXPRESSION_OP(||)

#if IUTEST_HAS_ARITHMETIC_EXPRESSION_DECOMPOSE
    IIUT_DECL_EXPRESSION_OP_LHS(+)
    IIUT_DECL_EXPRESSION_OP_LHS(-)
    IIUT_DECL_EXPRESSION_OP_LHS(*)
    IIUT_DECL_EXPRESSION_OP_LHS(/)
    IIUT_DECL_EXPRESSION_OP_LHS(%)
#endif

#if IUTEST_HAS_BITWISE_EXPRESSION_DECOMPOSE
    IIUT_DECL_EXPRESSION_OP_LHS(&)
    IIUT_DECL_EXPRESSION_OP_LHS(|)
    IIUT_DECL_EXPRESSION_OP_LHS(^)
    IIUT_DECL_EXPRESSION_OP_LHS(<<)
    IIUT_DECL_EXPRESSION_OP_LHS(>>)
#endif

private:
    template<typename U>
    ExpressionLHS<U> OperandResult(const U& lhs) const
    {
        return ExpressionLHS<U>(lhs, m_message);
    }